

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O2

void generate_a_record(Person *person)

{
  Person_PhoneNumber *this;
  string number;
  string email;
  string name;
  allocator local_71;
  string local_70;
  string local_50;
  string local_30;
  
  *(byte *)(person->_has_bits_).has_bits_ = (byte)(person->_has_bits_).has_bits_[0] | 4;
  person->id_ = 0;
  std::__cxx11::string::string((string *)&local_30,"John Doe",(allocator *)&local_50);
  Messages::Person::_internal_set_name(person,&local_30);
  std::__cxx11::string::string((string *)&local_50,"JohnDoe@gmail.com",(allocator *)&local_70);
  Messages::Person::_internal_set_email(person,&local_50);
  std::__cxx11::string::string((string *)&local_70,"032-9898-8765",&local_71);
  this = google::protobuf::RepeatedPtrField<Messages::Person_PhoneNumber>::Add(&person->phones_);
  Messages::Person_PhoneNumber::_internal_set_number(this,&local_70);
  Messages::Person_PhoneNumber::_internal_set_type(this,Person_PhoneType_MOBILE);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void generate_a_record(Messages::Person* person) {
  int id = 0;
  person->set_id(id);
  string name = "John Doe";
  person->set_name(name);
  string email = "JohnDoe@gmail.com";
  person->set_email(email);
  string number = "032-9898-8765";
  Messages::Person::PhoneNumber* phone_number = person->add_phones();
  phone_number->set_number(number);
  phone_number->set_type(Messages::Person::MOBILE);
}